

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization.cpp
# Opt level: O2

unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>
__thiscall
duckdb::CompressedMaterialization::GetIntegralCompress
          (CompressedMaterialization *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *input,
          BaseStatistics *stats)

{
  LogicalType *other;
  _Head_base<0UL,_duckdb::Expression_*,_false> context;
  bool bVar1;
  pointer pEVar2;
  idx_t iVar3;
  uint64_t uVar4;
  idx_t iVar5;
  BaseStatistics *in_RCX;
  BaseStatistics *pBVar6;
  _Any_data *arguments_00;
  hugeint_t value;
  hugeint_t value_00;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  arguments;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_468;
  Value min;
  LogicalType local_420;
  LogicalType cast_type;
  LogicalType local_3c8;
  LogicalType local_3b0;
  Value max;
  _Any_data local_358;
  pointer local_348;
  Value range_value;
  ScalarFunction compress_function;
  BaseStatistics compress_stats;
  
  pBVar6 = in_RCX;
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)stats);
  iVar3 = GetTypeIdSize((pEVar2->return_type).physical_type_);
  if ((iVar3 != 1) && (bVar1 = NumericStats::HasMinMax(in_RCX), bVar1)) {
    context._M_head_impl =
         input[1].super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    NumericStats::Min(&min,in_RCX);
    NumericStats::Max(&max,in_RCX);
    bVar1 = Value::operator<(&max,&min);
    other = &pEVar2->return_type;
    if (bVar1) {
      value.upper = (int64_t)pBVar6;
      value.lower = 0x7fffffffffffffff;
      Value::HUGEINT(&range_value,(Value *)0xffffffffffffffff,value);
    }
    else {
      arguments.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      arguments.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      arguments.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      make_uniq<duckdb::BoundConstantExpression,duckdb::Value&>((duckdb *)&compress_function,&max);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&arguments,
                 (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                  *)&compress_function);
      if (compress_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
          _vptr_Function != (_func_int **)0x0) {
        (**(code **)(*compress_function.super_BaseScalarFunction.super_SimpleFunction.super_Function
                      ._vptr_Function + 8))();
      }
      make_uniq<duckdb::BoundConstantExpression,duckdb::Value&>((duckdb *)&compress_function,&min);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&arguments,
                 (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                  *)&compress_function);
      if (compress_function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
          _vptr_Function != (_func_int **)0x0) {
        (**(code **)(*compress_function.super_BaseScalarFunction.super_SimpleFunction.super_Function
                      ._vptr_Function + 8))();
      }
      LogicalType::LogicalType(&local_420,other);
      SubtractFunction::GetFunction((ScalarFunction *)&compress_stats,other,other);
      arguments_00 = &local_358;
      local_358._M_unused._M_object =
           arguments.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_358._8_8_ =
           arguments.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_348 = arguments.
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      arguments.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      arguments.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      arguments.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_468._M_head_impl = (FunctionData *)0x0;
      BoundFunctionExpression::BoundFunctionExpression
                ((BoundFunctionExpression *)&compress_function,&local_420,
                 (ScalarFunction *)&compress_stats,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)arguments_00,
                 (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                  *)&local_468,false);
      if (local_468._M_head_impl != (FunctionData *)0x0) {
        (*(local_468._M_head_impl)->_vptr_FunctionData[1])();
      }
      local_468._M_head_impl = (FunctionData *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_358._M_pod_data);
      ScalarFunction::~ScalarFunction((ScalarFunction *)&compress_stats);
      LogicalType::~LogicalType(&local_420);
      LogicalType::LogicalType(&local_3b0,SQLNULL);
      Value::Value((Value *)&cast_type,&local_3b0);
      LogicalType::~LogicalType(&local_3b0);
      bVar1 = ExpressionExecutor::TryEvaluateScalar
                        ((ClientContext *)context._M_head_impl,(Expression *)&compress_function,
                         (Value *)&cast_type);
      if (bVar1) {
        Value::Value(&range_value,(Value *)&cast_type);
      }
      else {
        value_00.upper = (int64_t)arguments_00;
        value_00.lower = 0x7fffffffffffffff;
        Value::HUGEINT(&range_value,(Value *)0xffffffffffffffff,value_00);
      }
      Value::~Value((Value *)&cast_type);
      BoundFunctionExpression::~BoundFunctionExpression
                ((BoundFunctionExpression *)&compress_function);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&arguments);
    }
    Value::~Value(&max);
    Value::~Value(&min);
    LogicalType::LogicalType((LogicalType *)&compress_function,UBIGINT);
    bVar1 = Value::DefaultTryCastAs(&range_value,(LogicalType *)&compress_function,false);
    LogicalType::~LogicalType((LogicalType *)&compress_function);
    if (bVar1) {
      uVar4 = UBigIntValue::Get(&range_value);
      LogicalType::LogicalType(&cast_type);
      if (uVar4 < 0x100) {
        LogicalType::LogicalType((LogicalType *)&compress_function,UTINYINT);
      }
      else if (uVar4 < 0x10000) {
        LogicalType::LogicalType((LogicalType *)&compress_function,USMALLINT);
      }
      else if (uVar4 >> 0x20 == 0) {
        LogicalType::LogicalType((LogicalType *)&compress_function,UINTEGER);
      }
      else {
        LogicalType::LogicalType((LogicalType *)&compress_function,UBIGINT);
      }
      LogicalType::operator=(&cast_type,(LogicalType *)&compress_function);
      LogicalType::~LogicalType((LogicalType *)&compress_function);
      iVar3 = GetTypeIdSize(cast_type.physical_type_);
      iVar5 = GetTypeIdSize((pEVar2->return_type).physical_type_);
      if (iVar3 == iVar5) {
        this->optimizer = (Optimizer *)0x0;
      }
      else {
        CMIntegralCompressFun::GetFunction(&compress_function,other,&cast_type);
        arguments.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        arguments.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        arguments.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&arguments,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   stats);
        NumericStats::Min((Value *)&compress_stats,in_RCX);
        make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                  ((duckdb *)&min,(Value *)&compress_stats);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&arguments,
                   (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                    *)&min);
        if (min.type_._0_8_ != 0) {
          (**(code **)(*(long *)min.type_._0_8_ + 8))();
        }
        min.type_.id_ = INVALID;
        min.type_.physical_type_ = ~INVALID;
        min.type_._2_6_ = 0;
        Value::~Value((Value *)&compress_stats);
        compress_stats.type.id_ = INVALID;
        compress_stats.type.physical_type_ = ~INVALID;
        compress_stats.type._2_6_ = 0;
        make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType&,duckdb::ScalarFunction&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,decltype(nullptr)>
                  (&local_420,(ScalarFunction *)&cast_type,
                   (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)&compress_function,(void **)&arguments);
        LogicalType::LogicalType(&local_3c8,&cast_type);
        BaseStatistics::CreateEmpty(&compress_stats,&local_3c8);
        LogicalType::~LogicalType(&local_3c8);
        BaseStatistics::CopyBase(&compress_stats,in_RCX);
        Value::Value(&max,0);
        Value::DefaultCastAs(&min,&max,&cast_type,false);
        NumericStats::SetMin(&compress_stats,&min);
        Value::~Value(&min);
        Value::~Value(&max);
        Value::DefaultCastAs(&min,&range_value,&cast_type,false);
        NumericStats::SetMax(&compress_stats,&min);
        Value::~Value(&min);
        BaseStatistics::ToUnique((BaseStatistics *)&min);
        make_uniq<duckdb::CompressExpression,duckdb::unique_ptr<duckdb::BoundFunctionExpression,std::default_delete<duckdb::BoundFunctionExpression>,true>,duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                  ((duckdb *)this,
                   (unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                    *)&local_420,
                   (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    *)&min);
        ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
        ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                     *)&min);
        BaseStatistics::~BaseStatistics(&compress_stats);
        if ((long *)local_420._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_420._0_8_ + 8))();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   *)&arguments);
        ScalarFunction::~ScalarFunction(&compress_function);
      }
      LogicalType::~LogicalType(&cast_type);
    }
    else {
      this->optimizer = (Optimizer *)0x0;
    }
    Value::~Value(&range_value);
    return (unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>
           )(unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>
             )this;
  }
  this->optimizer = (Optimizer *)0x0;
  return (unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>)
         (unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>)
         this;
}

Assistant:

unique_ptr<CompressExpression> CompressedMaterialization::GetIntegralCompress(unique_ptr<Expression> input,
                                                                              const BaseStatistics &stats) {
	const auto &type = input->return_type;
	if (GetTypeIdSize(type.InternalType()) == 1 || !NumericStats::HasMinMax(stats)) {
		return nullptr;
	}

	// Get range and cast to UBIGINT (might fail for HUGEINT, in which case we just return)
	Value range_value = GetIntegralRangeValue(context, type, stats);
	if (!range_value.DefaultTryCastAs(LogicalType::UBIGINT)) {
		return nullptr;
	}

	// Get the smallest type that the range can fit into
	const auto range = UBigIntValue::Get(range_value);
	LogicalType cast_type;
	if (range <= NumericLimits<uint8_t>().Maximum()) {
		cast_type = LogicalType::UTINYINT;
	} else if (range <= NumericLimits<uint16_t>().Maximum()) {
		cast_type = LogicalType::USMALLINT;
	} else if (range <= NumericLimits<uint32_t>().Maximum()) {
		cast_type = LogicalType::UINTEGER;
	} else {
		D_ASSERT(range <= NumericLimits<uint64_t>().Maximum());
		cast_type = LogicalType::UBIGINT;
	}

	// Check if type that fits the range is smaller than the input type
	if (GetTypeIdSize(cast_type.InternalType()) == GetTypeIdSize(type.InternalType())) {
		return nullptr;
	}
	D_ASSERT(GetTypeIdSize(cast_type.InternalType()) < GetTypeIdSize(type.InternalType()));

	// Compressing will yield a benefit
	auto compress_function = CMIntegralCompressFun::GetFunction(type, cast_type);
	vector<unique_ptr<Expression>> arguments;
	arguments.emplace_back(std::move(input));
	arguments.emplace_back(make_uniq<BoundConstantExpression>(NumericStats::Min(stats)));
	auto compress_expr =
	    make_uniq<BoundFunctionExpression>(cast_type, compress_function, std::move(arguments), nullptr);

	auto compress_stats = BaseStatistics::CreateEmpty(cast_type);
	compress_stats.CopyBase(stats);
	NumericStats::SetMin(compress_stats, Value(0).DefaultCastAs(cast_type));
	NumericStats::SetMax(compress_stats, range_value.DefaultCastAs(cast_type));

	return make_uniq<CompressExpression>(std::move(compress_expr), compress_stats.ToUnique());
}